

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  tftp_state_data *state_00;
  tftp_state_data *state_01;
  Curl_easy *data_00;
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  int iVar3;
  tftp_event_t tVar4;
  timediff_t tVar5;
  time_t tVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  ushort *puVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long size;
  undefined8 uVar14;
  ushort *puVar15;
  ulong maxlen;
  tftp_state_data *state;
  ulong uVar16;
  ushort *puVar17;
  bool bVar18;
  char buffer [256];
  
  state_00 = (data->conn->proto).tftpc;
  tVar5 = Curl_timeleft(state_00->data,(curltime *)0x0,state_00->state == TFTP_STATE_START);
  if (tVar5 < 0) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
  }
  else {
    tVar6 = time((time_t *)0x0);
    if ((long)state_00->retry_time + state_00->rx_time < tVar6) {
      tVar6 = time((time_t *)0x0);
      state_00->rx_time = tVar6;
      *done = false;
      CVar2 = tftp_state_machine(state_00,TFTP_EVENT_TIMEOUT);
      goto joined_r0x00156cc9;
    }
  }
  *done = false;
  iVar3 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(*piVar7,buffer,0x100);
    Curl_failf(data,"%s",pcVar8);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_01 = (data->conn->proto).tftpc;
  buffer[0] = -0x80;
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  sVar9 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(long)state_01->blksize + 4,0,
                   (sockaddr *)&state_01->remote_addr,(socklen_t *)buffer);
  iVar3 = (int)sVar9;
  state_01->rbytes = iVar3;
  state_01->remote_addrlen = buffer._0_4_;
  if (iVar3 < 4) {
    Curl_failf(data,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar15 = (ushort *)(state_01->rpacket).data;
    tVar4 = (tftp_event_t)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
    state_01->event = tVar4;
    switch(tVar4) {
    case TFTP_EVENT_DATA:
      if (((iVar3 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
           (ushort)(puVar15[1] << 8 | puVar15[1] >> 8))) &&
         (CVar2 = Curl_client_write(data,1,(char *)(puVar15 + 2),(ulong)(iVar3 - 4)),
         CVar2 != CURLE_OK)) {
        tftp_state_machine(state_01,TFTP_EVENT_ERROR);
        return CVar2;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      state_01->error = (uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8);
      sVar11 = tftp_strnlen((char *)(puVar15 + 2),(ulong)(iVar3 - 4));
      if (((sVar11 < iVar3 - 4) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"TFTP error: %s",puVar15 + 2);
      }
      break;
    case TFTP_EVENT_OACK:
      data_00 = state_01->data;
      state_01->blksize = 0x200;
      puVar10 = (ushort *)((long)puVar15 + (ulong)(iVar3 - 2) + 2);
      puVar15 = puVar15 + 1;
      while (puVar15 < puVar10) {
        maxlen = (long)puVar10 - (long)puVar15;
        sVar11 = tftp_strnlen((char *)puVar15,maxlen);
        uVar16 = sVar11 + 1;
        if (maxlen < uVar16 || maxlen - uVar16 == 0) {
LAB_00156cea:
          pcVar8 = "Malformed ACK packet, rejecting";
LAB_00156cfa:
          Curl_failf(data_00,pcVar8);
          return CURLE_TFTP_ILLEGAL;
        }
        sVar12 = tftp_strnlen((char *)(uVar16 + (long)puVar15),maxlen - uVar16);
        uVar16 = sVar11 + sVar12 + 2;
        if (maxlen < uVar16) goto LAB_00156cea;
        sVar13 = strlen((char *)puVar15);
        pcVar8 = (char *)((long)puVar15 + sVar13 + 1);
        if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
            (0 < pcVar1->log_level)))) {
          Curl_infof(data_00,"got option=(%s) value=(%s)",puVar15,pcVar8);
        }
        puVar17 = (ushort *)(uVar16 + (long)puVar15);
        iVar3 = curl_strnequal((char *)puVar15,"blksize",7);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal((char *)puVar15,"tsize",5);
          puVar15 = puVar17;
          if (iVar3 != 0) {
            size = strtol(pcVar8,(char **)0x0,10);
            if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                (0 < pcVar1->log_level)))) {
              Curl_infof(data_00,"%s (%ld)","tsize parsed from OACK",size);
            }
            if (((data_00->state).field_0x776 & 2) == 0) {
              if (size == 0) {
                Curl_failf(data_00,"invalid tsize -:%s:- value in OACK packet",pcVar8);
                return CURLE_TFTP_ILLEGAL;
              }
              Curl_pgrsSetDownloadSize(data_00,size);
            }
          }
        }
        else {
          uVar16 = strtol(pcVar8,(char **)0x0,10);
          if (uVar16 == 0) {
            pcVar8 = "invalid blocksize value in OACK packet";
            goto LAB_00156cfa;
          }
          if (0xffb8 < (long)uVar16) {
            pcVar8 = "blksize is larger than max supported";
            uVar14 = 0xffb8;
LAB_00156d2e:
            Curl_failf(data_00,"%s (%d)",pcVar8,uVar14);
            return CURLE_TFTP_ILLEGAL;
          }
          if ((long)uVar16 < 8) {
            pcVar8 = "blksize is smaller than min supported";
            uVar14 = 8;
            goto LAB_00156d2e;
          }
          if ((long)state_01->requested_blksize < (long)uVar16) {
            Curl_failf(data_00,"%s (%ld)","server requested blksize larger than allocated",uVar16);
            return CURLE_TFTP_ILLEGAL;
          }
          state_01->blksize = (int)uVar16;
          puVar15 = puVar17;
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data_00,"%s (%d) %s (%d)","blksize parsed from OACK",uVar16 & 0xffffffff,
                       "requested");
          }
        }
      }
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar3 = Curl_pgrsUpdate(data);
    if (iVar3 != 0) {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  CVar2 = tftp_state_machine(state_00,state_00->event);
joined_r0x00156cc9:
  if (CVar2 == CURLE_OK) {
    CVar2 = CURLE_OK;
    bVar18 = state_00->state == TFTP_STATE_FIN;
    *done = bVar18;
    if (bVar18) {
      Curl_xfer_setup_nop(data);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}